

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

string * __thiscall
Catch::Matchers::HasSizeMatcher::describe_abi_cxx11_
          (string *__return_storage_ptr__,HasSizeMatcher *this)

{
  ReusableStringStream *this_00;
  undefined1 local_28 [8];
  ReusableStringStream sstr;
  HasSizeMatcher *this_local;
  
  sstr.m_oss = (ostream *)this;
  ReusableStringStream::ReusableStringStream((ReusableStringStream *)local_28);
  this_00 = ReusableStringStream::operator<<
                      ((ReusableStringStream *)local_28,(char (*) [13])"has size == ");
  ReusableStringStream::operator<<(this_00,&this->m_target_size);
  ReusableStringStream::str_abi_cxx11_(__return_storage_ptr__,(ReusableStringStream *)local_28);
  ReusableStringStream::~ReusableStringStream((ReusableStringStream *)local_28);
  return __return_storage_ptr__;
}

Assistant:

std::string HasSizeMatcher::describe() const {
        ReusableStringStream sstr;
        sstr << "has size == " << m_target_size;
        return sstr.str();
    }